

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
* __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandDepMap
          (map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
           *__return_storage_ptr__,CapnpcCppMain *this,TemplateContext *templateContext,
          Schema schema)

{
  Method method_00;
  Method method_01;
  bool bVar1;
  Which WVar2;
  uint index;
  unsigned_long *puVar3;
  NullableValue<kj::StringTree> *pNVar4;
  StringTree *pSVar5;
  mapped_type *pmVar6;
  Iterator IVar7;
  Type type;
  Range<unsigned_long> RVar8;
  Schema local_5e0;
  Type local_5d8;
  Maybe<kj::StringTree> local_5c8;
  undefined1 local_588 [8];
  NullableValue<kj::StringTree> dep_4;
  undefined1 auStack_540 [4];
  uint location_4;
  Schema local_530;
  RawBrandedSchema *local_528;
  Schema SStack_520;
  uint16_t local_518;
  undefined6 uStack_516;
  SegmentReader *pSStack_510;
  CapTableReader *local_508;
  void *pvStack_500;
  WirePointer *local_4f8;
  StructDataBitCount SStack_4f0;
  StructPointerCount SStack_4ec;
  undefined2 uStack_4ea;
  Maybe<kj::StringTree> local_4e8;
  undefined1 local_4a8 [8];
  NullableValue<kj::StringTree> dep_3;
  undefined1 auStack_460 [4];
  uint location_3;
  Schema local_450;
  RawBrandedSchema *local_448;
  Schema SStack_440;
  uint16_t local_438;
  undefined6 uStack_436;
  SegmentReader *pSStack_430;
  CapTableReader *local_428;
  void *pvStack_420;
  WirePointer *local_418;
  StructDataBitCount SStack_410;
  StructPointerCount SStack_40c;
  undefined2 uStack_40a;
  Maybe<kj::StringTree> local_408;
  undefined1 local_3c8 [8];
  NullableValue<kj::StringTree> dep_2;
  undefined1 auStack_380 [4];
  uint location_2;
  Method method;
  unsigned_long i_1;
  Iterator __end4_1;
  Iterator __begin4_1;
  Range<unsigned_long> *__range4_1;
  MethodList methods;
  Maybe<kj::StringTree> local_2c8;
  undefined1 local_288 [8];
  NullableValue<kj::StringTree> dep_1;
  uint uStack_240;
  uint location_1;
  unsigned_long i;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_long> *__range4;
  SuperclassList superclasses;
  InterfaceSchema interface;
  Maybe<kj::StringTree> local_1c0;
  undefined1 local_180 [8];
  NullableValue<kj::StringTree> dep;
  undefined1 local_138 [4];
  uint location;
  Field field;
  undefined1 local_e8 [8];
  Iterator __end3;
  undefined1 local_c8 [8];
  Iterator __begin3;
  FieldList local_b0;
  FieldList *local_78;
  FieldList *__range3;
  Reader local_60;
  undefined1 local_29;
  TemplateContext *local_28;
  TemplateContext *templateContext_local;
  CapnpcCppMain *this_local;
  Schema schema_local;
  map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  *depMap;
  
  local_29 = 0;
  local_28 = templateContext;
  templateContext_local = (TemplateContext *)this;
  this_local = (CapnpcCppMain *)schema.raw;
  schema_local.raw = (RawBrandedSchema *)__return_storage_ptr__;
  std::
  map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  ::map(__return_storage_ptr__);
  Schema::getProto(&local_60,(Schema *)&this_local);
  WVar2 = capnp::schema::Node::Reader::which(&local_60);
  switch(WVar2) {
  case FILE:
  case ENUM:
  case ANNOTATION:
    break;
  case STRUCT:
    __begin3._8_8_ = Schema::asStruct((Schema *)&this_local);
    StructSchema::getFields(&local_b0,(StructSchema *)&__begin3.index);
    local_78 = &local_b0;
    IVar7 = StructSchema::FieldList::begin(local_78);
    __end3._8_8_ = IVar7.container;
    __begin3.container._0_4_ = IVar7.index;
    local_c8 = (undefined1  [8])__end3._8_8_;
    IVar7 = StructSchema::FieldList::end(local_78);
    field.proto._reader._40_8_ = IVar7.container;
    __end3.container._0_4_ = IVar7.index;
    local_e8 = (undefined1  [8])field.proto._reader._40_8_;
    while (bVar1 = _::
                   IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                   ::operator!=((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                                 *)local_c8,
                                (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                                 *)local_e8), bVar1) {
      _::IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
      operator*((Field *)local_138,
                (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                 *)local_c8);
      index = StructSchema::Field::getIndex((Field *)local_138);
      dep.field_1._52_4_ = _::RawBrandedSchema::makeDepLocation(FIELD,index);
      type = StructSchema::Field::getType((Field *)local_138);
      makeBrandDepInitializer(&local_1c0,this,type);
      pNVar4 = kj::_::readMaybe<kj::StringTree>(&local_1c0);
      kj::_::NullableValue<kj::StringTree>::NullableValue
                ((NullableValue<kj::StringTree> *)local_180,pNVar4);
      kj::Maybe<kj::StringTree>::~Maybe(&local_1c0);
      pSVar5 = kj::_::NullableValue::operator_cast_to_StringTree_((NullableValue *)local_180);
      if (pSVar5 != (StringTree *)0x0) {
        pSVar5 = kj::_::NullableValue<kj::StringTree>::operator*
                           ((NullableValue<kj::StringTree> *)local_180);
        pSVar5 = kj::mv<kj::StringTree>(pSVar5);
        pmVar6 = std::
                 map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                 ::operator[](__return_storage_ptr__,
                              (key_type_conflict *)((long)&dep.field_1 + 0x34));
        kj::StringTree::operator=(pmVar6,pSVar5);
      }
      kj::_::NullableValue<kj::StringTree>::~NullableValue
                ((NullableValue<kj::StringTree> *)local_180);
      _::IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
      operator++((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                  *)local_c8);
    }
    break;
  case INTERFACE:
    superclasses.list.reader._40_8_ = Schema::asInterface((Schema *)&this_local);
    InterfaceSchema::getSuperclasses
              ((SuperclassList *)&__range4,(InterfaceSchema *)&superclasses.list.reader.nestingLimit
              );
    RVar8 = kj::indices<capnp::InterfaceSchema::SuperclassList&>((SuperclassList *)&__range4);
    __begin4.value = RVar8.begin_;
    __end4 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin4);
    i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin4);
    while (bVar1 = kj::Range<unsigned_long>::Iterator::operator!=(&__end4,(Iterator *)&i), bVar1) {
      puVar3 = kj::Range<unsigned_long>::Iterator::operator*(&__end4);
      uStack_240 = (uint)*puVar3;
      dep_1.field_1._52_4_ = _::RawBrandedSchema::makeDepLocation(SUPERCLASS,uStack_240);
      methods.list.reader._40_8_ =
           InterfaceSchema::SuperclassList::operator[]((SuperclassList *)&__range4,uStack_240);
      makeBrandDepInitializer(&local_2c8,this,(Schema)methods.list.reader._40_8_);
      pNVar4 = kj::_::readMaybe<kj::StringTree>(&local_2c8);
      kj::_::NullableValue<kj::StringTree>::NullableValue
                ((NullableValue<kj::StringTree> *)local_288,pNVar4);
      kj::Maybe<kj::StringTree>::~Maybe(&local_2c8);
      pSVar5 = kj::_::NullableValue::operator_cast_to_StringTree_((NullableValue *)local_288);
      if (pSVar5 != (StringTree *)0x0) {
        pSVar5 = kj::_::NullableValue<kj::StringTree>::operator*
                           ((NullableValue<kj::StringTree> *)local_288);
        pSVar5 = kj::mv<kj::StringTree>(pSVar5);
        pmVar6 = std::
                 map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                 ::operator[](__return_storage_ptr__,
                              (key_type_conflict *)((long)&dep_1.field_1 + 0x34));
        kj::StringTree::operator=(pmVar6,pSVar5);
      }
      kj::_::NullableValue<kj::StringTree>::~NullableValue
                ((NullableValue<kj::StringTree> *)local_288);
      kj::Range<unsigned_long>::Iterator::operator++(&__end4);
    }
    InterfaceSchema::getMethods
              ((MethodList *)&__range4_1,(InterfaceSchema *)&superclasses.list.reader.nestingLimit);
    RVar8 = kj::indices<capnp::InterfaceSchema::MethodList&>((MethodList *)&__range4_1);
    __begin4_1.value = RVar8.begin_;
    __end4_1 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin4_1);
    i_1 = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin4_1);
    while (bVar1 = kj::Range<unsigned_long>::Iterator::operator!=(&__end4_1,(Iterator *)&i_1), bVar1
          ) {
      puVar3 = kj::Range<unsigned_long>::Iterator::operator*(&__end4_1);
      method.proto._reader._40_8_ = *puVar3;
      InterfaceSchema::MethodList::operator[]
                ((Method *)auStack_380,(MethodList *)&__range4_1,method.proto._reader.nestingLimit);
      dep_2.field_1._52_4_ =
           _::RawBrandedSchema::makeDepLocation(METHOD_PARAMS,method.proto._reader.nestingLimit);
      local_418 = method.proto._reader.pointers;
      SStack_410 = method.proto._reader.dataSize;
      SStack_40c = method.proto._reader.pointerCount;
      uStack_40a = method.proto._reader._38_2_;
      local_428 = method.proto._reader.capTable;
      pvStack_420 = method.proto._reader.data;
      local_438 = method.ordinal;
      uStack_436 = method._10_6_;
      pSStack_430 = method.proto._reader.segment;
      local_448 = _auStack_380;
      SStack_440 = method.parent.super_Schema.raw;
      local_450.raw =
           (RawBrandedSchema *)InterfaceSchema::Method::getParamType((Method *)auStack_380);
      kj::StringPtr::StringPtr((StringPtr *)auStack_460,"Params");
      method_00._8_8_ = SStack_440.raw;
      method_00.parent.super_Schema.raw = (Schema)(Schema)local_448;
      method_00.proto._reader.segment = (SegmentReader *)_local_438;
      method_00.proto._reader.capTable = (CapTableReader *)pSStack_430;
      method_00.proto._reader.data = local_428;
      method_00.proto._reader.pointers = (WirePointer *)pvStack_420;
      method_00.proto._reader._32_8_ = local_418;
      method_00.proto._reader.nestingLimit = SStack_410;
      method_00.proto._reader._44_2_ = SStack_40c;
      method_00.proto._reader._46_2_ = uStack_40a;
      makeBrandDepInitializer
                (&local_408,this,method_00,(StructSchema)local_450.raw,(StringPtr)_auStack_460);
      pNVar4 = kj::_::readMaybe<kj::StringTree>(&local_408);
      kj::_::NullableValue<kj::StringTree>::NullableValue
                ((NullableValue<kj::StringTree> *)local_3c8,pNVar4);
      kj::Maybe<kj::StringTree>::~Maybe(&local_408);
      pSVar5 = kj::_::NullableValue::operator_cast_to_StringTree_((NullableValue *)local_3c8);
      if (pSVar5 != (StringTree *)0x0) {
        pSVar5 = kj::_::NullableValue<kj::StringTree>::operator*
                           ((NullableValue<kj::StringTree> *)local_3c8);
        pSVar5 = kj::mv<kj::StringTree>(pSVar5);
        pmVar6 = std::
                 map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                 ::operator[](__return_storage_ptr__,
                              (key_type_conflict *)((long)&dep_2.field_1 + 0x34));
        kj::StringTree::operator=(pmVar6,pSVar5);
      }
      kj::_::NullableValue<kj::StringTree>::~NullableValue
                ((NullableValue<kj::StringTree> *)local_3c8);
      dep_3.field_1._52_4_ =
           _::RawBrandedSchema::makeDepLocation(METHOD_RESULTS,method.proto._reader.nestingLimit);
      local_4f8 = method.proto._reader.pointers;
      SStack_4f0 = method.proto._reader.dataSize;
      SStack_4ec = method.proto._reader.pointerCount;
      uStack_4ea = method.proto._reader._38_2_;
      local_508 = method.proto._reader.capTable;
      pvStack_500 = method.proto._reader.data;
      local_518 = method.ordinal;
      uStack_516 = method._10_6_;
      pSStack_510 = method.proto._reader.segment;
      local_528 = _auStack_380;
      SStack_520 = method.parent.super_Schema.raw;
      local_530.raw =
           (RawBrandedSchema *)InterfaceSchema::Method::getResultType((Method *)auStack_380);
      kj::StringPtr::StringPtr((StringPtr *)auStack_540,"Results");
      method_01._8_8_ = SStack_520.raw;
      method_01.parent.super_Schema.raw = (Schema)(Schema)local_528;
      method_01.proto._reader.segment = (SegmentReader *)_local_518;
      method_01.proto._reader.capTable = (CapTableReader *)pSStack_510;
      method_01.proto._reader.data = local_508;
      method_01.proto._reader.pointers = (WirePointer *)pvStack_500;
      method_01.proto._reader._32_8_ = local_4f8;
      method_01.proto._reader.nestingLimit = SStack_4f0;
      method_01.proto._reader._44_2_ = SStack_4ec;
      method_01.proto._reader._46_2_ = uStack_4ea;
      makeBrandDepInitializer
                (&local_4e8,this,method_01,(StructSchema)local_530.raw,(StringPtr)_auStack_540);
      pNVar4 = kj::_::readMaybe<kj::StringTree>(&local_4e8);
      kj::_::NullableValue<kj::StringTree>::NullableValue
                ((NullableValue<kj::StringTree> *)local_4a8,pNVar4);
      kj::Maybe<kj::StringTree>::~Maybe(&local_4e8);
      pSVar5 = kj::_::NullableValue::operator_cast_to_StringTree_((NullableValue *)local_4a8);
      if (pSVar5 != (StringTree *)0x0) {
        pSVar5 = kj::_::NullableValue<kj::StringTree>::operator*
                           ((NullableValue<kj::StringTree> *)local_4a8);
        pSVar5 = kj::mv<kj::StringTree>(pSVar5);
        pmVar6 = std::
                 map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                 ::operator[](__return_storage_ptr__,
                              (key_type_conflict *)((long)&dep_3.field_1 + 0x34));
        kj::StringTree::operator=(pmVar6,pSVar5);
      }
      kj::_::NullableValue<kj::StringTree>::~NullableValue
                ((NullableValue<kj::StringTree> *)local_4a8);
      kj::Range<unsigned_long>::Iterator::operator++(&__end4_1);
    }
    break;
  case CONST:
    dep_4.field_1._52_4_ = _::RawBrandedSchema::makeDepLocation(CONST_TYPE,0);
    local_5e0.raw = (RawBrandedSchema *)Schema::asConst((Schema *)&this_local);
    local_5d8 = ConstSchema::getType((ConstSchema *)&local_5e0);
    makeBrandDepInitializer(&local_5c8,this,local_5d8);
    pNVar4 = kj::_::readMaybe<kj::StringTree>(&local_5c8);
    kj::_::NullableValue<kj::StringTree>::NullableValue
              ((NullableValue<kj::StringTree> *)local_588,pNVar4);
    kj::Maybe<kj::StringTree>::~Maybe(&local_5c8);
    pSVar5 = kj::_::NullableValue::operator_cast_to_StringTree_((NullableValue *)local_588);
    if (pSVar5 != (StringTree *)0x0) {
      pSVar5 = kj::_::NullableValue<kj::StringTree>::operator*
                         ((NullableValue<kj::StringTree> *)local_588);
      pSVar5 = kj::mv<kj::StringTree>(pSVar5);
      pmVar6 = std::
               map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
               ::operator[](__return_storage_ptr__,
                            (key_type_conflict *)((long)&dep_4.field_1 + 0x34));
      kj::StringTree::operator=(pmVar6,pSVar5);
    }
    kj::_::NullableValue<kj::StringTree>::~NullableValue((NullableValue<kj::StringTree> *)local_588)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<uint, kj::StringTree>
  makeBrandDepMap(const TemplateContext& templateContext, Schema schema) {
    // Build deps. This is separate from makeBrandDepInitializers to give calling code the
    // opportunity to count the number of dependencies, to calculate array sizes.
    std::map<uint, kj::StringTree> depMap;

#define ADD_DEP(kind, index, ...) \
    { \
      uint location = _::RawBrandedSchema::makeDepLocation( \
          _::RawBrandedSchema::DepKind::kind, index); \
      KJ_IF_MAYBE(dep, makeBrandDepInitializer(__VA_ARGS__)) { \
        depMap[location] = kj::mv(*dep); \
      } \
    }

    switch (schema.getProto().which()) {
      case schema::Node::FILE:
      case schema::Node::ENUM:
      case schema::Node::ANNOTATION:
        break;

      case schema::Node::STRUCT:
        for (auto field: schema.asStruct().getFields()) {
          ADD_DEP(FIELD, field.getIndex(), field.getType());
        }
        break;
      case schema::Node::INTERFACE: {
        auto interface = schema.asInterface();
        auto superclasses = interface.getSuperclasses();
        for (auto i: kj::indices(superclasses)) {
          ADD_DEP(SUPERCLASS, i, superclasses[i]);
        }
        auto methods = interface.getMethods();
        for (auto i: kj::indices(methods)) {
          auto method = methods[i];
          ADD_DEP(METHOD_PARAMS, i, method, method.getParamType(), "Params");
          ADD_DEP(METHOD_RESULTS, i, method, method.getResultType(), "Results");
        }
        break;
      }
      case schema::Node::CONST:
        ADD_DEP(CONST_TYPE, 0, schema.asConst().getType());
        break;
    }
#undef ADD_DEP
    return depMap;
  }